

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_autovacuum_pages
              (sqlite3 *db,_func_uint_void_ptr_char_ptr_u32_u32_u32 *xCallback,void *pArg,
              _func_void_void_ptr *xDestructor)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c68a);
  if (*(long *)(in_RDI + 0x148) != 0) {
    (**(code **)(in_RDI + 0x148))(*(undefined8 *)(in_RDI + 0x140));
  }
  *(undefined8 *)(in_RDI + 0x150) = in_RSI;
  *(undefined8 *)(in_RDI + 0x140) = in_RDX;
  *(undefined8 *)(in_RDI + 0x148) = in_RCX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c6f4);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_autovacuum_pages(
  sqlite3 *db,                 /* Attach the hook to this database */
  unsigned int (*xCallback)(void*,const char*,u32,u32,u32),
  void *pArg,                  /* Argument to the function */
  void (*xDestructor)(void*)   /* Destructor for pArg */
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    if( xDestructor ) xDestructor(pArg);
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( db->xAutovacDestr ){
    db->xAutovacDestr(db->pAutovacPagesArg);
  }
  db->xAutovacPages = xCallback;
  db->pAutovacPagesArg = pArg;
  db->xAutovacDestr = xDestructor;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}